

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_inverse(void)

{
  int iVar1;
  matrix2 *pmVar2;
  void *hasInverse;
  matrix2 scratchMatrix;
  matrix2 inverted;
  matrix2 identity;
  matrix2 originalMatrix;
  
  identity.field_0.m[3] = 2.0;
  matrix2_identity((matrix2 *)((long)&inverted.field_0 + 0x18));
  matrix2_identity((matrix2 *)((long)&identity.field_0 + 0x18));
  pmVar2 = matrix2_set((matrix2 *)((long)&scratchMatrix.field_0 + 0x18),
                       (matrix2 *)((long)&identity.field_0 + 0x18));
  pmVar2 = matrix2_invert(pmVar2);
  if (pmVar2 == (matrix2 *)0x0) {
    originalMatrix.field_0.m[3] = (double)anon_var_dwarf_4d8;
  }
  else {
    matrix2_identity((matrix2 *)&hasInverse);
    matrix2_multiply((matrix2 *)&hasInverse,(matrix2 *)((long)&scratchMatrix.field_0 + 0x18));
    matrix2_multiply((matrix2 *)&hasInverse,(matrix2 *)((long)&identity.field_0 + 0x18));
    iVar1 = matrix2_equals((matrix2 *)((long)&inverted.field_0 + 0x18),(matrix2 *)&hasInverse);
    if (iVar1 == 0) {
      originalMatrix.field_0.m[3] = (double)anon_var_dwarf_4ee;
    }
    else {
      originalMatrix.field_0.m[3] = 0.0;
    }
  }
  return (char *)originalMatrix.field_0.m[3];
}

Assistant:

static char *test_matrix2_inverse(void)
{
	struct matrix2 originalMatrix = {2, 0, -1, 5};
	struct matrix2 identity;
	struct matrix2 inverted;
	struct matrix2 scratchMatrix;
	void *hasInverse = NULL;

	matrix2_identity(&identity);

	matrix2_identity(&originalMatrix);

	hasInverse = matrix2_invert(matrix2_set(&inverted, &originalMatrix));

	test_assert(hasInverse);

	matrix2_identity(&scratchMatrix);
	matrix2_multiply(&scratchMatrix, &inverted);
	matrix2_multiply(&scratchMatrix, &originalMatrix);

	test_assert(matrix2_equals(&identity, &scratchMatrix));

	return NULL;
}